

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O1

int CVodeGetNumLinRhsEvals(void *cvode_mem,long *nfevalsLS)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeGetNumLinRhsEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *nfevalsLS = local_18->nfeDQ;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumLinRhsEvals(void *cvode_mem, long int *nfevalsLS)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  int      retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, "CVodeGetNumLinRhsEvals",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);
  *nfevalsLS = cvls_mem->nfeDQ;
  return(CVLS_SUCCESS);
}